

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<TPZFlopCounter>::PrepareZ
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *y,
          TPZFMatrix<TPZFlopCounter> *z,TPZFlopCounter beta,int opt)

{
  long lVar1;
  TPZFlopCounter *pTVar2;
  long col;
  int64_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar4 = (y->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar4);
  col = 0;
  lVar5 = lVar1;
  if (lVar1 < 1) {
    lVar5 = col;
  }
  if (lVar4 < 1) {
    lVar4 = col;
  }
  for (; col != lVar4; col = col + 1) {
    pTVar2 = TPZFMatrix<TPZFlopCounter>::operator()(z,0,col);
    if ((beta.fVal != 0.0) || (NAN(beta.fVal))) {
      if (z != y) {
        memcpy(pTVar2,y->fElem + (y->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow * col
               ,lVar1 * 8);
      }
      for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
        pTVar2 = TPZFMatrix<TPZFlopCounter>::operator()(z,lVar3,col);
        pTVar2->fVal = pTVar2->fVal * beta.fVal;
        TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
      }
    }
    else {
      for (lVar3 = 0; lVar1 * 8 - lVar3 != 0; lVar3 = lVar3 + 8) {
        *(undefined8 *)((long)&pTVar2->fVal + lVar3) = 0;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}